

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1angle.cc
# Opt level: O3

ostream * operator<<(ostream *os,S1Angle a)

{
  uint uVar1;
  size_t sVar2;
  ostream *poVar3;
  char buffer [13];
  char local_1d [13];
  
  uVar1 = snprintf(local_1d,0xd,"%.7f");
  if (uVar1 < 0xd) {
    sVar2 = strlen(local_1d);
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1d,sVar2);
    return os;
  }
  poVar3 = std::ostream::_M_insert<double>(a.radians_ * 57.29577951308232);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, S1Angle a) {
  double degrees = a.degrees();
  char buffer[13];
  int sz = snprintf(buffer, sizeof(buffer), "%.7f", degrees);
  if (sz >= 0 && sz < sizeof(buffer)) {
    return os << buffer;
  } else {
    return os << degrees;
  }
}